

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O1

void __thiscall ABlasterFX1::Effect(ABlasterFX1 *this)

{
  double dVar1;
  uint uVar2;
  PClassActor *type;
  FName local_24;
  DVector3 local_20;
  
  uVar2 = FRandom::GenRand32(&pr_bfx1t);
  if ((uVar2 & 0xc0) == 0) {
    local_24.Index = FName::NameManager::FindName(&FName::NameData,"BlasterSmoke",false);
    local_20.Z = (this->super_AFastProjectile).super_AActor.__Pos.Z + -8.0;
    dVar1 = (this->super_AFastProjectile).super_AActor.floorz;
    if (local_20.Z <= dVar1) {
      local_20.Z = dVar1;
    }
    local_20.X = (this->super_AFastProjectile).super_AActor.__Pos.X;
    local_20.Y = (this->super_AFastProjectile).super_AActor.__Pos.Y;
    type = ClassForSpawn(&local_24);
    AActor::StaticSpawn(type,&local_20,ALLOW_REPLACE,false);
  }
  return;
}

Assistant:

void ABlasterFX1::Effect ()
{
	if (pr_bfx1t() < 64)
	{
		Spawn("BlasterSmoke", PosAtZ(MAX(Z() - 8., floorz)), ALLOW_REPLACE);
	}
}